

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

char * __thiscall
cmConditionEvaluator::GetDefinitionIfUnquoted
          (cmConditionEvaluator *this,cmExpandedCommandArgument *argument)

{
  cmMakefile *this_00;
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  cmake *this_01;
  PolicyID id;
  string local_1f0;
  string local_1c0;
  undefined1 local_1a0 [8];
  ostringstream e;
  char *def;
  cmExpandedCommandArgument *argument_local;
  cmConditionEvaluator *this_local;
  
  if (((this->Policy54Status == WARN) || (this->Policy54Status == OLD)) ||
     (bVar1 = cmExpandedCommandArgument::WasQuoted(argument), !bVar1)) {
    this_00 = this->Makefile;
    psVar2 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
    this_local = (cmConditionEvaluator *)cmMakefile::GetDefinition(this_00,psVar2);
    if (((this_local != (cmConditionEvaluator *)0x0) &&
        (bVar1 = cmExpandedCommandArgument::WasQuoted(argument), bVar1)) &&
       ((this->Policy54Status == WARN &&
        (bVar1 = cmMakefile::HasCMP0054AlreadyBeenReported(this->Makefile,&this->ExecutionContext),
        !bVar1)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c0,(cmPolicies *)0x36,id);
      poVar3 = std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&local_1c0);
      poVar3 = std::operator<<((ostream *)local_1a0,"Quoted variables like \"");
      psVar2 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
      poVar3 = std::operator<<(poVar3,(string *)psVar2);
      std::operator<<(poVar3,
                      "\" will no longer be dereferenced when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                     );
      this_01 = cmMakefile::GetCMakeInstance(this->Makefile);
      std::__cxx11::ostringstream::str();
      cmake::IssueMessage(this_01,AUTHOR_WARNING,&local_1f0,&this->Backtrace);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    }
  }
  else {
    this_local = (cmConditionEvaluator *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char* cmConditionEvaluator::GetDefinitionIfUnquoted(
  cmExpandedCommandArgument const& argument) const
{
  if ((this->Policy54Status != cmPolicies::WARN &&
       this->Policy54Status != cmPolicies::OLD) &&
      argument.WasQuoted()) {
    return CM_NULLPTR;
  }

  const char* def = this->Makefile.GetDefinition(argument.GetValue());

  if (def && argument.WasQuoted() &&
      this->Policy54Status == cmPolicies::WARN) {
    if (!this->Makefile.HasCMP0054AlreadyBeenReported(
          this->ExecutionContext)) {
      std::ostringstream e;
      e << (cmPolicies::GetPolicyWarning(cmPolicies::CMP0054)) << "\n";
      e << "Quoted variables like \"" << argument.GetValue()
        << "\" will no longer be dereferenced "
           "when the policy is set to NEW.  "
           "Since the policy is not set the OLD behavior will be used.";

      this->Makefile.GetCMakeInstance()->IssueMessage(
        cmake::AUTHOR_WARNING, e.str(), this->Backtrace);
    }
  }

  return def;
}